

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlSetUniformSampler(int locIndex,uint textureId)

{
  uint *puVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 4) {
      lVar2 = 0;
      while( true ) {
        if (lVar2 == 4) {
          return;
        }
        if (RLGL.State.activeTextureId[lVar2] == 0) break;
        lVar2 = lVar2 + 1;
      }
      (*glad_glUniform1i)(locIndex,(int)lVar2 + 1);
      RLGL.State.activeTextureId[lVar2] = textureId;
      return;
    }
    puVar1 = RLGL.State.activeTextureId + lVar2;
    lVar2 = lVar2 + 1;
  } while (*puVar1 != textureId);
  return;
}

Assistant:

void rlSetUniformSampler(int locIndex, unsigned int textureId)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Check if texture is already active
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++) if (RLGL.State.activeTextureId[i] == textureId) return;

    // Register a new active texture for the internal batch system
    // NOTE: Default texture is always activated as GL_TEXTURE0
    for (int i = 0; i < MAX_BATCH_ACTIVE_TEXTURES; i++)
    {
        if (RLGL.State.activeTextureId[i] == 0)
        {
            glUniform1i(locIndex, 1 + i);              // Activate new texture unit
            RLGL.State.activeTextureId[i] = textureId; // Save texture id for binding on drawing
            break;
        }
    }
#endif
}